

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O0

void __thiscall QIBusSerializable::deserializeFrom(QIBusSerializable *this,QDBusArgument *argument)

{
  byte bVar1;
  QString *in_RSI;
  QHash<QString,_QDBusArgument> *in_RDI;
  long in_FS_OFFSET;
  QString key;
  QDBusVariant value;
  QDBusVariant *in_stack_ffffffffffffff78;
  QHash<QString,_QDBusArgument> *this_00;
  QDBusArgument in_stack_ffffffffffffff98;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  QVariant local_48;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QDBusArgument::operator>>((QDBusArgument *)in_RSI,(QString *)in_RDI);
  QDBusArgument::beginMap();
  while( true ) {
    bVar1 = QDBusArgument::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    QDBusArgument::beginMapEntry();
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x12f251);
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QDBusVariant::QDBusVariant((QDBusVariant *)0x12f28b);
    QDBusArgument::operator>>((QDBusArgument *)in_RSI,(QString *)&local_60);
    QDBusArgument::operator>>((QDBusArgument *)in_RSI,(QDBusVariant *)&local_28);
    QDBusArgument::endMapEntry();
    QDBusVariant::variant(in_stack_ffffffffffffff78);
    qvariant_cast<QDBusArgument>((QVariant *)in_stack_ffffffffffffff98.d);
    QHash<QString,_QDBusArgument>::operator[](this_00,in_RSI);
    QDBusArgument::operator=((QDBusArgument *)in_RDI,(QDBusArgument *)in_stack_ffffffffffffff78);
    QDBusArgument::~QDBusArgument((QDBusArgument *)&stack0xffffffffffffff98);
    QVariant::~QVariant(&local_48);
    QDBusVariant::~QDBusVariant((QDBusVariant *)0x12f30f);
    QString::~QString((QString *)0x12f319);
  }
  QDBusArgument::endMap();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusSerializable::deserializeFrom(const QDBusArgument &argument)
{
    argument >> name;

    argument.beginMap();
    while (!argument.atEnd()) {
        argument.beginMapEntry();
        QString key;
        QDBusVariant value;
        argument >> key;
        argument >> value;
        argument.endMapEntry();
        attachments[key] = qvariant_cast<QDBusArgument>(value.variant());
    }
    argument.endMap();
}